

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_iterator.c
# Opt level: O1

void kcc_iterator_reset(kcc_iterator_nbx *b)

{
  int *piVar1;
  kcc_joint *pkVar2;
  kcc_segment *pkVar3;
  gc_pose *pgVar4;
  undefined8 uVar5;
  vector3 *pvVar6;
  undefined4 uVar7;
  
  if (b == (kcc_iterator_nbx *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,9,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  if (b->current_index == (int *)0x0) {
    __assert_fail("b->current_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,10,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  piVar1 = b->next_index;
  if (piVar1 == (int *)0x0) {
    __assert_fail("b->next_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,0xb,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  pkVar2 = b->joint;
  if (pkVar2 != (kcc_joint *)0x0) {
    if (b->joint_type == (joint_type *)0x0) {
      __assert_fail("b->joint_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                    ,0xd,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
    }
    if (b->x_link != (gc_pose *)0x0) {
      if (b->has_next != (_Bool *)0x0) {
        *b->current_index = 0;
        *piVar1 = 1;
        pkVar3 = b->chain->segment;
        (pkVar2->field_1).revolute_joint.inertia = (pkVar3->joint).field_1.revolute_joint.inertia;
        uVar7 = *(undefined4 *)&(pkVar3->joint).field_0x4;
        uVar5 = *(undefined8 *)&(pkVar3->joint).field_1;
        pkVar2->type = (pkVar3->joint).type;
        *(undefined4 *)&pkVar2->field_0x4 = uVar7;
        *(undefined8 *)&pkVar2->field_1 = uVar5;
        pkVar3 = b->chain->segment;
        *b->joint_type = (pkVar3->joint).type;
        pgVar4 = b->x_link;
        pvVar6 = (pkVar3->joint_attachment).translation;
        pgVar4->rotation = (pkVar3->joint_attachment).rotation;
        pgVar4->translation = pvVar6;
        *b->has_next = 0 < b->chain->number_of_segments;
        return;
      }
      __assert_fail("b->has_next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                    ,0xf,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
    }
    __assert_fail("b->x_link",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,0xe,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  __assert_fail("b->joint",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                ,0xc,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
}

Assistant:

void kcc_iterator_reset(
        struct kcc_iterator_nbx *b)
{
    assert(b);
    assert(b->current_index);
    assert(b->next_index);
    assert(b->joint);
    assert(b->joint_type);
    assert(b->x_link);
    assert(b->has_next);

    int index = 0;

    *b->current_index = index;
    *b->next_index = index + 1;
    *b->joint = b->chain->segment[index].joint;
    *b->joint_type = b->chain->segment[index].joint.type;
    *b->x_link = b->chain->segment[index].joint_attachment;
    *b->has_next = (index < b->chain->number_of_segments);
}